

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTDMT_bufferPool * ZSTDMT_expandBufferPool(ZSTDMT_bufferPool *srcBufPool,uint maxNbBuffers)

{
  ZSTD_customMem cMem_00;
  uint in_ESI;
  ZSTDMT_bufferPool *in_RDI;
  ZSTDMT_bufferPool *newBufPool;
  size_t bSize;
  ZSTD_customMem cMem;
  ZSTD_allocFunction bSize_00;
  ZSTDMT_bufferPool *bufPool;
  ZSTDMT_bufferPool *in_stack_ffffffffffffffc0;
  uint maxNbBuffers_00;
  void *pvVar1;
  undefined4 in_stack_ffffffffffffffe8;
  ZSTDMT_bufferPool *local_8;
  
  if (in_RDI == (ZSTDMT_bufferPool *)0x0) {
    local_8 = (ZSTDMT_bufferPool *)0x0;
  }
  else {
    local_8 = in_RDI;
    if (in_RDI->totalBuffers < in_ESI) {
      bSize_00 = (in_RDI->cMem).customAlloc;
      bufPool = (ZSTDMT_bufferPool *)(in_RDI->cMem).customFree;
      pvVar1 = (in_RDI->cMem).opaque;
      maxNbBuffers_00 = (uint)(in_RDI->bufferSize >> 0x20);
      ZSTDMT_freeBufferPool(in_stack_ffffffffffffffc0);
      cMem_00.customFree._0_4_ = in_stack_ffffffffffffffe8;
      cMem_00.customAlloc = (ZSTD_allocFunction)pvVar1;
      cMem_00.customFree._4_4_ = in_ESI;
      cMem_00.opaque = in_RDI;
      local_8 = ZSTDMT_createBufferPool(maxNbBuffers_00,cMem_00);
      if (local_8 != (ZSTDMT_bufferPool *)0x0) {
        ZSTDMT_setBufferSize(bufPool,(size_t)bSize_00);
      }
    }
  }
  return local_8;
}

Assistant:

static ZSTDMT_bufferPool* ZSTDMT_expandBufferPool(ZSTDMT_bufferPool* srcBufPool, unsigned maxNbBuffers)
{
    if (srcBufPool==NULL) return NULL;
    if (srcBufPool->totalBuffers >= maxNbBuffers) /* good enough */
        return srcBufPool;
    /* need a larger buffer pool */
    {   ZSTD_customMem const cMem = srcBufPool->cMem;
        size_t const bSize = srcBufPool->bufferSize;   /* forward parameters */
        ZSTDMT_bufferPool* newBufPool;
        ZSTDMT_freeBufferPool(srcBufPool);
        newBufPool = ZSTDMT_createBufferPool(maxNbBuffers, cMem);
        if (newBufPool==NULL) return newBufPool;
        ZSTDMT_setBufferSize(newBufPool, bSize);
        return newBufPool;
    }
}